

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirBLOCK(void)

{
  bool bVar1;
  int iVar2;
  aint byte;
  aint val;
  aint teller;
  
  val = 0;
  iVar2 = ParseExpressionNoSyntaxError(&lp,&teller);
  if (iVar2 == 0) {
    Error("[BLOCK] Syntax Error in <length>",lp,SUPPRESS);
  }
  else {
    if (teller < 0) {
      Warning("Negative BLOCK?",(char *)0x0,W_PASS3);
    }
    bVar1 = comma(&lp);
    byte = 0;
    if (bVar1) {
      iVar2 = ParseExpression(&lp,&val);
      byte = val;
      if (iVar2 != 0) {
        check8(val);
        byte = val;
      }
    }
    EmitBlock(byte,teller,false,4);
  }
  return;
}

Assistant:

static void dirBLOCK() {
	aint teller,val = 0;
	if (ParseExpressionNoSyntaxError(lp, teller)) {
		if (teller < 0) {
			Warning("Negative BLOCK?");
		}
		if (comma(lp)) {
			if (ParseExpression(lp, val)) check8(val);
		}
		EmitBlock(val, teller);
	} else {
		Error("[BLOCK] Syntax Error in <length>", lp, SUPPRESS);
	}
}